

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureSocket.cpp
# Opt level: O1

ssize_t __thiscall
Jupiter::SecureSocket::recv(SecureSocket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  SSL *ssl;
  uint uVar1;
  Buffer *this_00;
  void *buf;
  size_t sVar2;
  
  if (this->m_ssl_data->handle == (SSL *)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    this_00 = Socket::getInternalBuffer(&this->super_Socket);
    Socket::Buffer::clear(this_00);
    ssl = (SSL *)this->m_ssl_data->handle;
    buf = Socket::Buffer::data(this_00);
    sVar2 = Socket::getBufferSize(&this->super_Socket);
    uVar1 = SSL_read(ssl,buf,(int)sVar2);
    if (0 < (int)uVar1) {
      Socket::Buffer::set_length(this_00,(ulong)uVar1);
    }
  }
  return (ulong)uVar1;
}

Assistant:

int Jupiter::SecureSocket::recv() {
	if (m_ssl_data->handle == nullptr)
		return -1;
	Jupiter::Socket::Buffer &buffer = this->getInternalBuffer();
	buffer.clear();
	int r = SSL_read(m_ssl_data->handle, buffer.data(), static_cast<int>(this->getBufferSize()));
	if (r > 0)
		buffer.set_length(r);
	return r;
}